

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization_test.cpp
# Opt level: O0

void __thiscall test2_base::check(test2_base *this)

{
  ostream *poVar1;
  runtime_error *prVar2;
  double *in_RDI;
  ostringstream oss_3;
  ostringstream oss_2;
  ostringstream oss_1;
  ostringstream oss;
  string local_690 [32];
  ostringstream local_670 [383];
  undefined1 local_4f1;
  string local_4f0 [32];
  ostringstream local_4d0 [383];
  undefined1 local_351;
  string local_350 [32];
  ostringstream local_330 [383];
  undefined1 local_1b1;
  string local_1b0 [48];
  ostringstream local_180 [384];
  
  if ((*in_RDI != 100.0) || (NAN(*in_RDI))) {
    std::__cxx11::ostringstream::ostringstream(local_180);
    poVar1 = std::operator<<((ostream *)local_180,"Error ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/serialization_test.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x1e);
    std::operator<<(poVar1," f.t==100");
    local_1b1 = 1;
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar2,local_1b0);
    local_1b1 = 0;
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((in_RDI[1] == 20.0) && (!NAN(in_RDI[1]))) {
    if (*(int *)(in_RDI + 2) != 0x41) {
      std::__cxx11::ostringstream::ostringstream(local_4d0);
      poVar1 = std::operator<<((ostream *)local_4d0,"Error ");
      poVar1 = std::operator<<(poVar1,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/serialization_test.cpp"
                              );
      poVar1 = std::operator<<(poVar1,":");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x20);
      std::operator<<(poVar1," x==65");
      local_4f1 = 1;
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar2,local_4f0);
      local_4f1 = 0;
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (*(int *)((long)in_RDI + 0x14) == 10) {
      return;
    }
    std::__cxx11::ostringstream::ostringstream(local_670);
    poVar1 = std::operator<<((ostream *)local_670,"Error ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/serialization_test.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x21);
    std::operator<<(poVar1," y==10");
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar2,local_690);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::ostringstream(local_330);
  poVar1 = std::operator<<((ostream *)local_330,"Error ");
  poVar1 = std::operator<<(poVar1,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/serialization_test.cpp"
                          );
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x1f);
  std::operator<<(poVar1," f.v==20");
  local_351 = 1;
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::runtime_error::runtime_error(prVar2,local_350);
  local_351 = 0;
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void check()
	{
		TEST(f.t==100);
		TEST(f.v==20);
		TEST(x==65);
		TEST(y==10);
	}